

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O0

void __thiscall QByteArrayMatcher::setPattern(QByteArrayMatcher *this,QByteArray *pattern)

{
  Data *pDVar1;
  char *pcVar2;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  QByteArray *cc;
  
  cc = in_RDI;
  QByteArray::operator=(in_RSI,in_RDI);
  pDVar1 = (Data *)QByteArray::constData((QByteArray *)0x4c15e3);
  in_RDI[0xc].d.d = pDVar1;
  pcVar2 = (char *)QByteArray::size(in_RSI);
  in_RDI[0xc].d.ptr = pcVar2;
  bm_init_skiptable((uchar *)cc,(qsizetype)pattern,(uchar *)in_RSI);
  return;
}

Assistant:

void QByteArrayMatcher::setPattern(const QByteArray &pattern)
{
    q_pattern = pattern;
    p.p = reinterpret_cast<const uchar *>(pattern.constData());
    p.l = pattern.size();
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}